

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superres_scale.c
# Opt level: O0

uint8_t get_superres_denom_from_qindex_energy
                  (int qindex,double *energy,double threshq,double threshp)

{
  long in_RSI;
  double in_XMM0_Qa;
  double dVar1;
  double in_XMM1_Qa;
  int k;
  double thresh;
  double tp;
  double tq;
  double q;
  aom_bit_depth_t in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  double local_50;
  int local_44;
  
  dVar1 = av1_convert_qindex_to_q(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  dVar1 = in_XMM0_Qa * dVar1 * dVar1;
  local_50 = in_XMM1_Qa * *(double *)(in_RSI + 8);
  if (dVar1 < local_50) {
    local_50 = dVar1;
  }
  local_44 = 0x10;
  while ((8 < local_44 && (*(double *)(in_RSI + (long)(local_44 + -1) * 8) <= local_50))) {
    local_44 = local_44 + -1;
  }
  return '\x18' - (char)local_44;
}

Assistant:

static uint8_t get_superres_denom_from_qindex_energy(int qindex, double *energy,
                                                     double threshq,
                                                     double threshp) {
  const double q = av1_convert_qindex_to_q(qindex, AOM_BITS_8);
  const double tq = threshq * q * q;
  const double tp = threshp * energy[1];
  const double thresh = AOMMIN(tq, tp);
  int k;
  for (k = SCALE_NUMERATOR * 2; k > SCALE_NUMERATOR; --k) {
    if (energy[k - 1] > thresh) break;
  }
  return 3 * SCALE_NUMERATOR - k;
}